

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpHeaders::takeOwnership(HttpHeaders *this,HttpHeaders *otherHeaders)

{
  Array<char> *pAVar1;
  Array<char> *params;
  Array<char> *str;
  Array<char> *__end1;
  Array<char> *__begin1;
  Vector<kj::Array<char>_> *__range1;
  HttpHeaders *otherHeaders_local;
  HttpHeaders *this_local;
  
  __end1 = Vector<kj::Array<char>_>::begin(&otherHeaders->ownedStrings);
  pAVar1 = Vector<kj::Array<char>_>::end(&otherHeaders->ownedStrings);
  for (; __end1 != pAVar1; __end1 = __end1 + 1) {
    params = mv<kj::Array<char>>(__end1);
    Vector<kj::Array<char>>::add<kj::Array<char>>
              ((Vector<kj::Array<char>> *)&this->ownedStrings,params);
  }
  Vector<kj::Array<char>_>::clear(&otherHeaders->ownedStrings);
  return;
}

Assistant:

void HttpHeaders::takeOwnership(HttpHeaders&& otherHeaders) {
  for (auto& str: otherHeaders.ownedStrings) {
    ownedStrings.add(kj::mv(str));
  }
  otherHeaders.ownedStrings.clear();
}